

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,
          pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool> *args_2)

{
  undefined8 *puVar1;
  group_type_pointer pgVar2;
  size_t *psVar3;
  value_type_pointer ppVar4;
  uint uVar5;
  ushort uVar6;
  char *pcVar7;
  undefined8 uVar8;
  ulong uVar9;
  long lVar10;
  group_type_pointer pgVar11;
  ulong uVar12;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>
  *ppVar13;
  group_type_pointer pgVar14;
  undefined1 auVar15 [16];
  
  pgVar11 = __return_storage_ptr__->pg;
  uVar9 = (ulong)__return_storage_ptr__->n;
  ppVar13 = __return_storage_ptr__->p;
  lVar10 = 1;
  while( true ) {
    pgVar14 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar15[0] = -(pgVar2->m[0].n == '\0');
    auVar15[1] = -(pgVar2->m[1].n == '\0');
    auVar15[2] = -(pgVar2->m[2].n == '\0');
    auVar15[3] = -(pgVar2->m[3].n == '\0');
    auVar15[4] = -(pgVar2->m[4].n == '\0');
    auVar15[5] = -(pgVar2->m[5].n == '\0');
    auVar15[6] = -(pgVar2->m[6].n == '\0');
    auVar15[7] = -(pgVar2->m[7].n == '\0');
    auVar15[8] = -(pgVar2->m[8].n == '\0');
    auVar15[9] = -(pgVar2->m[9].n == '\0');
    auVar15[10] = -(pgVar2->m[10].n == '\0');
    auVar15[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar15[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar15[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar15[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar15[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar6 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe;
    if (uVar6 == 0) {
      pgVar14->m[0xf].n = pgVar14->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar5 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar9 = (ulong)uVar5;
      ppVar4 = arrays_->elements_;
      uVar12 = (ulong)(uVar5 << 5);
      ppVar13 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>
                 *)((long)&ppVar4[pos0 * 0xf].first._M_len + uVar12);
      pcVar7 = args_1->_M_str;
      psVar3 = (size_t *)((long)&ppVar4[pos0 * 0xf].first._M_len + uVar12);
      *psVar3 = args_1->_M_len;
      psVar3[1] = (size_t)pcVar7;
      uVar8 = *(undefined8 *)&args_2->second;
      puVar1 = (undefined8 *)((long)&ppVar4[pos0 * 0xf].second.first + uVar12);
      *puVar1 = args_2->first;
      puVar1[1] = uVar8;
      pgVar14->m[uVar9].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar11 = pgVar14;
    }
    if (uVar6 != 0) break;
    pos0 = pos0 + lVar10 & arrays_->groups_size_mask;
    lVar10 = lVar10 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar9;
  __return_storage_ptr__->p = ppVar13;
  __return_storage_ptr__->pg = pgVar11;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }